

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  ImFontAtlas *this_00;
  size_t sVar1;
  void *in_RDX;
  char *in_RSI;
  byte *in_RDI;
  bool bVar2;
  float in_XMM0_Da;
  char *p;
  ImFontConfig font_cfg;
  void *data;
  size_t data_size;
  ImFontConfig *in_stack_ffffffffffffff30;
  size_t *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char local_72 [18];
  ImWchar *in_stack_ffffffffffffffa0;
  ImFontConfig *in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  char *pcVar3;
  ImFont *pIVar4;
  
  if ((*in_RDI & 1) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x779,"AddFontFromFileTTF","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  this_00 = (ImFontAtlas *)
            ImFileLoadToMemory(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38,
                               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  if (this_00 == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x77e,"AddFontFromFileTTF","ImGui ASSERT FAILED: %s",
                "(0) && \"Could not load font file!\"");
    pIVar4 = (ImFont *)0x0;
  }
  else {
    if (in_RDX == (void *)0x0) {
      ImFontConfig::ImFontConfig(in_stack_ffffffffffffff30);
    }
    else {
      memcpy(&stack0xffffffffffffff38,in_RDX,0x88);
    }
    if (local_72[0] == '\0') {
      pcVar3 = in_RSI;
      sVar1 = strlen(in_RSI);
      in_RSI = in_RSI + sVar1;
      while( true ) {
        bVar2 = false;
        if ((pcVar3 < in_RSI) && (bVar2 = false, in_RSI[-1] != '/')) {
          bVar2 = in_RSI[-1] != '\\';
        }
        if (!bVar2) break;
        in_RSI = in_RSI + -1;
      }
      ImFormatString((char *)(double)in_XMM0_Da,(size_t)local_72,(char *)0x28,"%s, %.0fpx",in_RSI);
    }
    pIVar4 = AddFontFromMemoryTTF
                       (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
  }
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}